

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

TCGv_i64 gen_lea_modrm_1(DisasContext *s,AddressParts a)

{
  TCGContext *tcg_ctx;
  long lVar1;
  TCGv_i64 arg1;
  TCGv_i64 *ppTVar2;
  
  tcg_ctx = s->uc->tcg_ctx;
  lVar1 = (long)a.index;
  if (lVar1 < 0) {
    if (-1 < (long)a.base) {
      ppTVar2 = tcg_ctx->cpu_regs + a.base;
      goto LAB_0052d4ef;
    }
  }
  else {
    if ((long)a.scale == 0) {
      ppTVar2 = tcg_ctx->cpu_regs + lVar1;
    }
    else {
      ppTVar2 = &s->A0;
      tcg_gen_shli_i64_x86_64(tcg_ctx,s->A0,tcg_ctx->cpu_regs[lVar1],(long)a.scale);
    }
    arg1 = *ppTVar2;
    if (-1 < (long)a.base) {
      ppTVar2 = &s->A0;
      tcg_gen_op3_x86_64(tcg_ctx,INDEX_op_add_i64,(TCGArg)(s->A0 + (long)tcg_ctx),
                         (TCGArg)(arg1 + (long)tcg_ctx),
                         (TCGArg)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_regs[a.base]));
LAB_0052d4ef:
      arg1 = *ppTVar2;
    }
    if (arg1 != (TCGv_i64)0x0) {
      if (a.disp == 0) {
        return arg1;
      }
      tcg_gen_addi_i64_x86_64(tcg_ctx,s->A0,arg1,a.disp);
      goto code_r0x0052d508;
    }
  }
  tcg_gen_op2_x86_64(tcg_ctx,INDEX_op_movi_i64,(TCGArg)(s->A0 + (long)tcg_ctx),a.disp);
code_r0x0052d508:
  return s->A0;
}

Assistant:

static TCGv gen_lea_modrm_1(DisasContext *s, AddressParts a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv ea = NULL;

    if (a.index >= 0) {
        if (a.scale == 0) {
            ea = tcg_ctx->cpu_regs[a.index];
        } else {
            tcg_gen_shli_tl(tcg_ctx, s->A0, tcg_ctx->cpu_regs[a.index], a.scale);
            ea = s->A0;
        }
        if (a.base >= 0) {
            tcg_gen_add_tl(tcg_ctx, s->A0, ea, tcg_ctx->cpu_regs[a.base]);
            ea = s->A0;
        }
    } else if (a.base >= 0) {
        ea = tcg_ctx->cpu_regs[a.base];
    }
    if (!ea) {
        tcg_gen_movi_tl(tcg_ctx, s->A0, a.disp);
        ea = s->A0;
    } else if (a.disp != 0) {
        tcg_gen_addi_tl(tcg_ctx, s->A0, ea, a.disp);
        ea = s->A0;
    }

    return ea;
}